

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O1

int __thiscall cmCPackGenerator::InstallProject(cmCPackGenerator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmCPackLog *pcVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  size_t sVar10;
  char *pcVar11;
  ostream *poVar12;
  uint uVar13;
  pointer arg;
  string *psVar14;
  bool bVar15;
  long *__s;
  mode_t default_dir_mode_v;
  string bareTempInstallDirectory;
  string tempInstallDirectoryStr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items;
  ostringstream cmCPackLog_msg;
  mode_t local_244;
  mode_t *local_240;
  long *local_238;
  string local_230;
  string local_210;
  cmCPackGenerator *local_1f0;
  long *local_1e8 [2];
  long local_1d8 [2];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  string *local_1b0;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Install projects",0x10);
  std::ios::widen((char)(ostringstream *)local_1a8 + (char)*(undefined8 *)(local_1a8._0_8_ + -0x18))
  ;
  std::ostream::put((char)local_1a8);
  std::ostream::flush();
  pcVar3 = this->Logger;
  std::__cxx11::stringbuf::str();
  _Var4._M_p = local_210._M_dataplus._M_p;
  sVar10 = strlen(local_210._M_dataplus._M_p);
  cmCPackLog::Log(pcVar3,1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                  ,0xaf,_Var4._M_p,sVar10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  CleanTemporaryDirectory(this);
  pcVar2 = local_1a8 + 0x10;
  local_1a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CPACK_TEMPORARY_INSTALL_DIRECTORY","");
  pcVar11 = GetOption(this,(string *)local_1a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,pcVar11,(allocator<char> *)local_1e8);
  if ((pointer)local_1a8._0_8_ != pcVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  local_1e8[0] = local_1d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1e8,local_210._M_dataplus._M_p,
             local_210._M_dataplus._M_p + local_210._M_string_length);
  local_1a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CPACK_SET_DESTDIR","");
  pcVar11 = GetOption(this,(string *)local_1a8);
  bVar5 = cmSystemTools::IsOn(pcVar11);
  paVar1 = &local_230.field_2;
  local_230._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"CPACK_SET_DESTDIR","");
  pcVar11 = GetOption(this,&local_230);
  bVar6 = cmSystemTools::IsInternallyOn(pcVar11);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != paVar1) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  bVar15 = bVar5 || bVar6;
  if ((pointer)local_1a8._0_8_ != pcVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (!bVar5 && !bVar6) {
    (*this->_vptr_cmCPackGenerator[0xb])(this);
    std::__cxx11::string::append((char *)local_1e8);
  }
  local_238 = local_1e8[0];
  bVar7 = cmsys::SystemTools::MakeDirectory(&local_210,(mode_t *)0x0);
  if (bVar7) {
    if (bVar5 || bVar6) {
      local_1a8._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"DESTDIR=","");
      std::__cxx11::string::append(local_1a8);
      cmsys::SystemTools::PutEnv((string *)local_1a8);
    }
    else {
      local_1a8._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"DESTDIR=","");
      cmsys::SystemTools::PutEnv((string *)local_1a8);
    }
    if ((pointer)local_1a8._0_8_ != pcVar2) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    local_244 = 0;
    local_1a8._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_1a8,"CPACK_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS","");
    pcVar11 = GetOption(this,(string *)local_1a8);
    if ((pointer)local_1a8._0_8_ != pcVar2) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if ((pcVar11 == (char *)0x0) || (*pcVar11 == '\0')) {
      local_240 = (mode_t *)0x0;
    }
    else {
      local_1c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_1c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
      local_1c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1a8._0_8_ = pcVar2;
      sVar10 = strlen(pcVar11);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pcVar11,pcVar11 + sVar10);
      cmSystemTools::ExpandListArgument((string *)local_1a8,&local_1c8,false);
      local_1f0 = this;
      if ((pointer)local_1a8._0_8_ != pcVar2) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      bVar7 = local_1c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start ==
              local_1c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
      local_240 = &local_244;
      if (!bVar7) {
        local_1b0 = local_1c8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        arg = local_1c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
        psVar14 = local_1c8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        do {
          bVar8 = cmFSPermissions::stringToModeT(arg,&local_244);
          if (!bVar8) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,"Invalid permission value \'",0x1a);
            poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_1a8,(arg->_M_dataplus)._M_p,arg->_M_string_length)
            ;
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar12,"\'. CPACK_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS value is invalid.",
                       0x40);
            std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
            std::ostream::put((char)poVar12);
            std::ostream::flush();
            pcVar3 = local_1f0->Logger;
            std::__cxx11::stringbuf::str();
            _Var4._M_p = local_230._M_dataplus._M_p;
            sVar10 = strlen(local_230._M_dataplus._M_p);
            cmCPackLog::Log(pcVar3,0x10,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                            ,0xde,_Var4._M_p,sVar10);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_230._M_dataplus._M_p != &local_230.field_2) {
              operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
            std::ios_base::~ios_base(local_138);
            psVar14 = local_1b0;
            if (!bVar8) {
              local_240 = (mode_t *)0x0;
              break;
            }
          }
          arg = arg + 1;
          bVar7 = arg == psVar14;
        } while (!bVar7);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1c8);
      this = local_1f0;
      uVar13 = 0;
      if (!bVar7) goto LAB_0014742e;
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1a8,(char *)local_238,(allocator<char> *)&local_230);
    pcVar2 = local_1a8 + 0x10;
    iVar9 = (*this->_vptr_cmCPackGenerator[0x10])(this,(ulong)bVar15,local_1a8);
    if ((pointer)local_1a8._0_8_ != pcVar2) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    uVar13 = 0;
    if (iVar9 != 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1a8,(char *)local_238,(allocator<char> *)&local_230);
      iVar9 = (*this->_vptr_cmCPackGenerator[0x11])(this,(ulong)bVar15,local_1a8);
      if ((pointer)local_1a8._0_8_ != pcVar2) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if (iVar9 != 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_1a8,(char *)local_238,(allocator<char> *)&local_230);
        iVar9 = (*this->_vptr_cmCPackGenerator[0x12])(this,(ulong)bVar15,local_1a8,local_240);
        if ((pointer)local_1a8._0_8_ != pcVar2) {
          operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
        }
        uVar13 = 0;
        if (iVar9 != 0) {
          iVar9 = (*this->_vptr_cmCPackGenerator[0x13])(this,(ulong)bVar15,&local_210,local_240);
          if ((bVar5 || bVar6) && iVar9 != 0) {
            local_1a8._0_8_ = pcVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"DESTDIR=","");
            cmsys::SystemTools::PutEnv((string *)local_1a8);
            if ((pointer)local_1a8._0_8_ != pcVar2) {
              operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
            }
            uVar13 = 1;
          }
          else {
            uVar13 = (uint)(iVar9 != 0);
          }
        }
      }
    }
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Problem creating temporary directory: ",0x26);
    __s = (long *)"(NULL)";
    if (local_238 != (long *)0x0) {
      __s = local_238;
    }
    sVar10 = strlen((char *)__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,(char *)__s,sVar10);
    std::ios::widen((char)(ostream *)local_1a8 + (char)*(undefined8 *)(local_1a8._0_8_ + -0x18));
    std::ostream::put((char)local_1a8);
    std::ostream::flush();
    pcVar3 = this->Logger;
    std::__cxx11::stringbuf::str();
    _Var4._M_p = local_230._M_dataplus._M_p;
    sVar10 = strlen(local_230._M_dataplus._M_p);
    cmCPackLog::Log(pcVar3,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0xc1,_Var4._M_p,sVar10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_230._M_dataplus._M_p != paVar1) {
      operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    uVar13 = 0;
  }
LAB_0014742e:
  if (local_1e8[0] != local_1d8) {
    operator_delete(local_1e8[0],local_1d8[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  return uVar13;
}

Assistant:

int cmCPackGenerator::InstallProject()
{
  cmCPackLogger(cmCPackLog::LOG_OUTPUT, "Install projects" << std::endl);
  this->CleanTemporaryDirectory();

  std::string bareTempInstallDirectory =
    this->GetOption("CPACK_TEMPORARY_INSTALL_DIRECTORY");
  std::string tempInstallDirectoryStr = bareTempInstallDirectory;
  bool setDestDir = cmSystemTools::IsOn(this->GetOption("CPACK_SET_DESTDIR")) |
    cmSystemTools::IsInternallyOn(this->GetOption("CPACK_SET_DESTDIR"));
  if (!setDestDir) {
    tempInstallDirectoryStr += this->GetPackagingInstallPrefix();
  }

  const char* tempInstallDirectory = tempInstallDirectoryStr.c_str();
  int res = 1;
  if (!cmsys::SystemTools::MakeDirectory(bareTempInstallDirectory)) {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
                  "Problem creating temporary directory: "
                    << (tempInstallDirectory ? tempInstallDirectory : "(NULL)")
                    << std::endl);
    return 0;
  }

  if (setDestDir) {
    std::string destDir = "DESTDIR=";
    destDir += tempInstallDirectory;
    cmSystemTools::PutEnv(destDir);
  } else {
    // Make sure there is no destdir
    cmSystemTools::PutEnv("DESTDIR=");
  }

  // prepare default created directory permissions
  mode_t default_dir_mode_v = 0;
  mode_t* default_dir_mode = nullptr;
  const char* default_dir_install_permissions =
    this->GetOption("CPACK_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS");
  if (default_dir_install_permissions && *default_dir_install_permissions) {
    std::vector<std::string> items;
    cmSystemTools::ExpandListArgument(default_dir_install_permissions, items);
    for (const auto& arg : items) {
      if (!cmFSPermissions::stringToModeT(arg, default_dir_mode_v)) {
        cmCPackLogger(cmCPackLog::LOG_ERROR,
                      "Invalid permission value '"
                        << arg
                        << "'."
                           " CPACK_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS "
                           "value is invalid."
                        << std::endl);
        return 0;
      }
    }

    default_dir_mode = &default_dir_mode_v;
  }

  // If the CPackConfig file sets CPACK_INSTALL_COMMANDS then run them
  // as listed
  if (!this->InstallProjectViaInstallCommands(setDestDir,
                                              tempInstallDirectory)) {
    return 0;
  }

  // If the CPackConfig file sets CPACK_INSTALL_SCRIPT then run them
  // as listed
  if (!this->InstallProjectViaInstallScript(setDestDir,
                                            tempInstallDirectory)) {
    return 0;
  }

  // If the CPackConfig file sets CPACK_INSTALLED_DIRECTORIES
  // then glob it and copy it to CPACK_TEMPORARY_DIRECTORY
  // This is used in Source packaging
  if (!this->InstallProjectViaInstalledDirectories(
        setDestDir, tempInstallDirectory, default_dir_mode)) {
    return 0;
  }

  // If the project is a CMAKE project then run pre-install
  // and then read the cmake_install script to run it
  if (!this->InstallProjectViaInstallCMakeProjects(
        setDestDir, bareTempInstallDirectory, default_dir_mode)) {
    return 0;
  }

  if (setDestDir) {
    cmSystemTools::PutEnv("DESTDIR=");
  }

  return res;
}